

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexBuffer::prepare
          (RenderVertexBuffer *this,PrepareRenderPassContext *context)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  deUint32 viewPortWidth;
  deUint32 viewPortHeight;
  Context *pCVar1;
  DeviceInterface *deviceInterface;
  VkDevice device_00;
  VkRenderPass VVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  ProgramBinary *pPVar4;
  Handle<(vk::HandleType)14> *vertexShaderModule_00;
  Handle<(vk::HandleType)14> *fragmentShaderModule_00;
  VkDeviceSize VVar5;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  local_1d8;
  VkRenderPass local_1c0;
  undefined1 auStack_1b8 [8];
  VkVertexInputAttributeDescription vertexAttributeDescription;
  undefined1 local_1a0 [8];
  VkVertexInputBindingDescription vertexBindingDescription;
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  vertexBindingDescriptions;
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  vertexAttributeDescriptions;
  string local_158;
  Move<vk::Handle<(vk::HandleType)14>_> local_138;
  RefData<vk::Handle<(vk::HandleType)14>_> local_118;
  undefined1 local_f8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentShaderModule;
  allocator<char> local_c1;
  string local_c0;
  Move<vk::Handle<(vk::HandleType)14>_> local_a0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_80;
  undefined1 local_60 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexShaderModule;
  deUint32 subpass;
  VkRenderPass renderPass;
  VkDevice device;
  DeviceInterface *vkd;
  PrepareRenderPassContext *context_local;
  RenderVertexBuffer *this_local;
  
  pCVar1 = PrepareRenderPassContext::getContext(context);
  deviceInterface = Context::getDeviceInterface(pCVar1);
  pCVar1 = PrepareRenderPassContext::getContext(context);
  device_00 = Context::getDevice(pCVar1);
  VVar2 = PrepareRenderPassContext::getRenderPass(context);
  vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_
       = 0;
  pPVar3 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"vertex-buffer.vert",&local_c1);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_c0);
  ::vk::createShaderModule(&local_a0,deviceInterface,device_00,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_80,(Move *)&local_a0);
  data.deleter.m_deviceIface._0_4_ = (int)local_80.deleter.m_deviceIface;
  data.object.m_internal = local_80.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_80.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_80.deleter.m_device;
  data.deleter.m_allocator = local_80.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_60,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pPVar3 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"render-white.frag",
             (allocator<char> *)
             ((long)&vertexAttributeDescriptions.
                     super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_158);
  ::vk::createShaderModule(&local_138,deviceInterface,device_00,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_118,(Move *)&local_138);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_118.deleter.m_deviceIface;
  data_00.object.m_internal = local_118.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_118.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_118.deleter.m_device;
  data_00.deleter.m_allocator = local_118.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_f8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&vertexAttributeDescriptions.
                     super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
            *)&vertexBindingDescriptions.
               super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::vector((vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
            *)&vertexBindingDescription.inputRate);
  local_1a0._0_4_ = 0;
  local_1a0._4_4_ = 2;
  vertexBindingDescription.binding = 0;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::push_back((vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               *)&vertexBindingDescription.inputRate,(value_type *)local_1a0);
  auStack_1b8._0_4_ = 0;
  auStack_1b8._4_4_ = 0;
  vertexAttributeDescription.location = 0x10;
  vertexAttributeDescription.binding = 0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::push_back((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               *)&vertexBindingDescriptions.
                  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)auStack_1b8);
  local_1c0 = VVar2;
  vertexShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_60);
  fragmentShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_f8);
  viewPortWidth = PrepareRenderPassContext::getTargetWidth(context);
  viewPortHeight = PrepareRenderPassContext::getTargetHeight(context);
  local_1d8.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector(&local_1d8);
  createPipelineWithResources
            (deviceInterface,device_00,local_1c0,0,vertexShaderModule_00,fragmentShaderModule_00,
             viewPortWidth,viewPortHeight,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)&vertexBindingDescription.inputRate,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)&vertexBindingDescriptions.
                 super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d8,
             VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,(VkPushConstantRange *)0x0,&this->m_resources);
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  ~vector(&local_1d8);
  VVar5 = PrepareRenderPassContext::getBufferSize(context);
  this->m_bufferSize = VVar5;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~vector((vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
             *)&vertexBindingDescription.inputRate);
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
             *)&vertexBindingDescriptions.
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_60);
  return;
}

Assistant:

void RenderVertexBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&						vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice								device					= context.getContext().getDevice();
	const vk::VkRenderPass							renderPass				= context.getRenderPass();
	const deUint32									subpass					= 0;
	const vk::Unique<vk::VkShaderModule>			vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("vertex-buffer.vert"), 0));
	const vk::Unique<vk::VkShaderModule>			fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));

	vector<vk::VkVertexInputAttributeDescription>	vertexAttributeDescriptions;
	vector<vk::VkVertexInputBindingDescription>		vertexBindingDescriptions;

	{
		const vk::VkVertexInputBindingDescription vertexBindingDescription =
			{
				0,
				2,
				vk::VK_VERTEX_INPUT_RATE_VERTEX
			};

		vertexBindingDescriptions.push_back(vertexBindingDescription);
	}
	{
		const vk::VkVertexInputAttributeDescription vertexAttributeDescription =
		{
			0,
			0,
			vk::VK_FORMAT_R8G8_UNORM,
			0
		};

		vertexAttributeDescriptions.push_back(vertexAttributeDescription);
	}
	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vertexBindingDescriptions, vertexAttributeDescriptions, vector<vk::VkDescriptorSetLayoutBinding>(), vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);

	m_bufferSize = context.getBufferSize();
}